

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O0

bool __thiscall
draco::
DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id)

{
  bool bVar1;
  uint uVar2;
  CornerTable *this_00;
  reference pvVar3;
  MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *this_01;
  uint in_ESI;
  TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  *in_RDI;
  FaceIndex left_face_id;
  FaceIndex right_face_id;
  CornerIndex left_corner_id;
  CornerIndex right_corner_id;
  bool on_boundary;
  VertexIndex vert_id;
  FaceIndex face_id;
  VertexIndex prev_vert;
  VertexIndex next_vert;
  MeshAttributeCornerTable *in_stack_ffffffffffffff18;
  MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *in_stack_ffffffffffffff20;
  MeshAttributeCornerTable *in_stack_ffffffffffffff28;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff48;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> in_stack_ffffffffffffff4c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> in_stack_ffffffffffffff50;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> in_stack_ffffffffffffff54;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_a8;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_a4;
  uint local_a0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_9c;
  uint local_98;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_94;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_90;
  uint local_8c;
  ThisIndexType local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  byte local_71;
  uint local_70;
  uint local_6c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_24;
  uint local_20;
  uint local_1c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_18 [4];
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_8;
  bool local_1;
  
  local_8.value_ = in_ESI;
  bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
          ::IsFaceVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                           *)in_stack_ffffffffffffff28,(CornerIndex)(uint)in_stack_ffffffffffffff30)
  ;
  if (bVar1) {
    local_1 = true;
  }
  else {
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             *)0x186641);
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::push_back(in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
    this_00 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::corner_table(in_RDI);
    TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::corner_table(in_RDI);
    local_20 = local_8.value_;
    local_1c = (uint)MeshAttributeCornerTable::Next
                               (in_stack_ffffffffffffff18,
                                (CornerIndex)(uint)in_stack_ffffffffffffff20);
    local_18[0].value_ =
         (uint)MeshAttributeCornerTable::Vertex
                         (in_stack_ffffffffffffff18,(uint)in_stack_ffffffffffffff20);
    TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::corner_table(in_RDI);
    TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::corner_table(in_RDI);
    local_2c = local_8.value_;
    local_28 = (uint)MeshAttributeCornerTable::Previous
                               (in_stack_ffffffffffffff18,
                                (CornerIndex)(uint)in_stack_ffffffffffffff20);
    local_24.value_ =
         (uint)MeshAttributeCornerTable::Vertex
                         (in_stack_ffffffffffffff18,(uint)in_stack_ffffffffffffff20);
    bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                      (local_18,(IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                                &kInvalidVertexIndex);
    if ((bVar1) ||
       (bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                          (&local_24,
                           (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                           &kInvalidVertexIndex), bVar1)) {
      local_1 = false;
    }
    else {
      local_30 = local_18[0].value_;
      bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::IsVertexVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                 *)in_stack_ffffffffffffff18,
                                (VertexIndex)(uint)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      if (!bVar1) {
        local_34 = local_18[0].value_;
        TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
        ::MarkVertexVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             *)in_stack_ffffffffffffff28,(VertexIndex)(uint)((ulong)this_00 >> 0x20)
                           );
        in_stack_ffffffffffffff28 =
             (MeshAttributeCornerTable *)
             TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ::traversal_observer(in_RDI);
        local_38 = local_18[0].value_;
        TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
        ::corner_table(in_RDI);
        local_40 = local_8.value_;
        local_3c = (uint)MeshAttributeCornerTable::Next
                                   (in_stack_ffffffffffffff18,
                                    (CornerIndex)(uint)in_stack_ffffffffffffff20);
        MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::OnNewVertexVisited
                  ((MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *)
                   CONCAT44(in_stack_ffffffffffffff4c.value_,in_stack_ffffffffffffff48),
                   (VertexIndex)in_stack_ffffffffffffff54.value_,
                   (CornerIndex)in_stack_ffffffffffffff50.value_);
      }
      local_44 = local_24.value_;
      bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::IsVertexVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                 *)in_stack_ffffffffffffff18,
                                (VertexIndex)(uint)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      if (!bVar1) {
        local_48 = local_24.value_;
        TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
        ::MarkVertexVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             *)in_stack_ffffffffffffff28,(VertexIndex)(uint)((ulong)this_00 >> 0x20)
                           );
        in_stack_ffffffffffffff20 =
             TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ::traversal_observer(in_RDI);
        local_4c = local_24.value_;
        TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
        ::corner_table(in_RDI);
        local_54 = local_8.value_;
        local_50 = (uint)MeshAttributeCornerTable::Previous
                                   (in_stack_ffffffffffffff18,
                                    (CornerIndex)(uint)in_stack_ffffffffffffff20);
        MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::OnNewVertexVisited
                  ((MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *)
                   CONCAT44(in_stack_ffffffffffffff4c.value_,in_stack_ffffffffffffff48),
                   (VertexIndex)in_stack_ffffffffffffff54.value_,
                   (CornerIndex)in_stack_ffffffffffffff50.value_);
      }
LAB_00186897:
      bVar1 = std::
              vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ::empty((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       *)this_00);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar3 = std::
                 vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ::back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         *)in_stack_ffffffffffffff20);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_8,pvVar3);
        uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_8);
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_58,uVar2 / 3);
        bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                          (&local_8,(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                    &kInvalidCornerIndex);
        if (!bVar1) {
          local_5c = local_58.value_;
          bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ::IsFaceVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                   *)in_stack_ffffffffffffff28,(FaceIndex)(uint)this_00);
          if (!bVar1) {
LAB_0018694e:
            do {
              local_60 = local_58.value_;
              TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::MarkFaceVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                 *)in_stack_ffffffffffffff28,
                                (FaceIndex)(uint)((ulong)this_00 >> 0x20));
              this_01 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        ::traversal_observer(in_RDI);
              local_64 = local_58.value_;
              MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::
              OnNewFaceVisited(this_01,(FaceIndex)local_58.value_);
              TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::corner_table(in_RDI);
              local_6c = local_8.value_;
              local_68.value_ =
                   (uint)MeshAttributeCornerTable::Vertex
                                   (in_stack_ffffffffffffff18,(uint)in_stack_ffffffffffffff20);
              bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                                (&local_68,
                                 (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                                 &kInvalidVertexIndex);
              if (bVar1) {
                return false;
              }
              local_70 = local_68.value_;
              bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                      ::IsVertexVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                         *)in_stack_ffffffffffffff18,
                                        (VertexIndex)
                                        (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20));
              if (!bVar1) {
                TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ::corner_table(in_RDI);
                local_78 = local_68.value_;
                local_71 = MeshAttributeCornerTable::IsOnBoundary
                                     (in_stack_ffffffffffffff28,(VertexIndex)(uint)this_00);
                local_7c = local_68.value_;
                TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ::MarkVertexVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                     *)in_stack_ffffffffffffff28,
                                    (VertexIndex)(uint)((ulong)this_00 >> 0x20));
                TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ::traversal_observer(in_RDI);
                local_80 = local_68.value_;
                local_84 = local_8.value_;
                MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::
                OnNewVertexVisited((MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>
                                    *)CONCAT44(in_stack_ffffffffffffff4c.value_,
                                               in_stack_ffffffffffffff48),
                                   (VertexIndex)in_stack_ffffffffffffff54.value_,
                                   (CornerIndex)in_stack_ffffffffffffff50.value_);
                if ((local_71 & 1) == 0) {
                  TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ::corner_table(in_RDI);
                  local_8c = local_8.value_;
                  local_88.value_ =
                       (uint)MeshAttributeCornerTable::GetRightCorner
                                       (in_stack_ffffffffffffff28,(uint)this_00);
                  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                            (&local_8,&local_88);
                  uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_8);
                  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType
                            (&local_90,uVar2 / 3);
                  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator=
                            (&local_58,&local_90);
                  goto LAB_0018694e;
                }
              }
              TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::corner_table(in_RDI);
              local_98 = local_8.value_;
              local_94.value_ =
                   (uint)MeshAttributeCornerTable::GetRightCorner
                                   (in_stack_ffffffffffffff28,(uint)this_00);
              TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              ::corner_table(in_RDI);
              local_a0 = local_8.value_;
              local_9c.value_ =
                   (uint)MeshAttributeCornerTable::GetLeftCorner
                                   (in_stack_ffffffffffffff28,(uint)this_00);
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                                (&local_94,
                                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                 &kInvalidCornerIndex);
              if (bVar1) {
                local_a4.value_ = 0xffffffff;
              }
              else {
                uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_94);
                IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_a4,uVar2 / 3);
              }
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                                (&local_9c,
                                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                 &kInvalidCornerIndex);
              if (bVar1) {
                local_a8.value_ = 0xffffffff;
              }
              else {
                uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_9c);
                IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_a8,uVar2 / 3);
              }
              in_stack_ffffffffffffff54.value_ = local_a4.value_;
              bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                      ::IsFaceVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                       *)in_stack_ffffffffffffff28,(FaceIndex)(uint)this_00);
              if (bVar1) {
                in_stack_ffffffffffffff50.value_ = local_a8.value_;
                bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        ::IsFaceVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                         *)in_stack_ffffffffffffff28,(FaceIndex)(uint)this_00);
                if (bVar1) {
                  std::
                  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ::pop_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              *)0x186c04);
                  goto LAB_00186897;
                }
                IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_8,&local_9c)
                ;
                IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator=(&local_58,&local_a8);
                goto LAB_0018694e;
              }
              in_stack_ffffffffffffff4c.value_ = local_a8.value_;
              bVar1 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                      ::IsFaceVisited((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                       *)in_stack_ffffffffffffff28,(FaceIndex)(uint)this_00);
              if (!bVar1) goto LAB_00186c71;
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_8,&local_94);
              IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator=(&local_58,&local_a4);
            } while( true );
          }
        }
        std::
        vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ::pop_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    *)0x186947);
        goto LAB_00186897;
      }
      local_1 = true;
    }
  }
  return local_1;
LAB_00186c71:
  pvVar3 = std::
           vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ::back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   *)in_stack_ffffffffffffff20);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(pvVar3,&local_9c);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffff28);
  goto LAB_00186897;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }